

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UFFAtomTypesSectionParser.cpp
# Opt level: O0

void __thiscall
OpenMD::UFFAtomTypesSectionParser::parseLine
          (UFFAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  int iVar1;
  AtomType *AT;
  undefined8 uVar2;
  uint in_ECX;
  RealType in_RDX;
  RealType in_RDI;
  RealType Uj_00;
  RealType RVar3;
  RealType RVar4;
  RealType RVar5;
  RealType r1_00;
  RealType RVar6;
  double Radius_00;
  double Hard_00;
  RealType Radius;
  RealType Hard;
  RealType Xi;
  RealType Uj;
  RealType Vi;
  RealType Z1;
  RealType zeta;
  RealType D1;
  RealType x1;
  RealType theta0;
  RealType r1;
  UFFAdapter uffa;
  AtomType *atomType;
  string atomTypeName;
  int nTokens;
  StringTokenizer tokenizer;
  StringTokenizer *in_stack_fffffffffffffdf0;
  StringTokenizer *in_stack_fffffffffffffe00;
  string *in_stack_fffffffffffffe20;
  string *in_stack_fffffffffffffe28;
  ForceField *in_stack_fffffffffffffe30;
  StringTokenizer *in_stack_fffffffffffffe98;
  RealType in_stack_fffffffffffffea0;
  errorStruct *peVar7;
  undefined4 in_stack_fffffffffffffea8;
  allocator<char> *theta0_00;
  UFFAdapter local_e0;
  AtomType *local_d8;
  string local_d0 [32];
  int local_b0;
  allocator<char> local_99;
  string local_98 [124];
  uint local_1c;
  
  theta0_00 = &local_99;
  local_1c = in_ECX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28,
             (allocator<char> *)in_stack_fffffffffffffe20);
  StringTokenizer::StringTokenizer
            ((StringTokenizer *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
             in_stack_fffffffffffffe20);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  iVar1 = StringTokenizer::countTokens(in_stack_fffffffffffffe00);
  local_b0 = iVar1;
  if (iVar1 < 0xc) {
    peVar7 = &painCave;
    snprintf(painCave.errMsg,2000,"UFFAtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)local_1c);
    peVar7->isFatal = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(in_stack_fffffffffffffe98);
    AT = ForceField::getAtomType(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    local_d8 = AT;
    if (AT == (AtomType *)0x0) {
      uVar2 = std::__cxx11::string::c_str();
      peVar7 = &painCave;
      snprintf(painCave.errMsg,2000,
               "UFFAtomTypesSectionParser Error: Atom Type [%s] has not been created yet\n",uVar2);
      peVar7->isFatal = 1;
      simError();
    }
    else {
      UFFAdapter::UFFAdapter(&local_e0,AT);
      Uj_00 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffe30);
      StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffe30);
      StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffe30);
      StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffe30);
      StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffe30);
      RVar3 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffe30);
      RVar4 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffe30);
      RVar5 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffe30);
      StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffe30);
      in_stack_fffffffffffffdf0 =
           (StringTokenizer *)
           StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffe30);
      r1_00 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffe30);
      ForceFieldOptions::getDistanceUnitScaling((ForceFieldOptions *)0x28c9da);
      ForceFieldOptions::getAngleUnitScaling((ForceFieldOptions *)0x28ca0f);
      ForceFieldOptions::getDistanceUnitScaling((ForceFieldOptions *)0x28ca44);
      ForceFieldOptions::getEnergyUnitScaling((ForceFieldOptions *)0x28ca79);
      RVar6 = ForceFieldOptions::getChargeUnitScaling((ForceFieldOptions *)0x28caae);
      Radius_00 = RVar3 * RVar6;
      RVar3 = ForceFieldOptions::getEnergyUnitScaling((ForceFieldOptions *)0x28cae3);
      Hard_00 = RVar4 * RVar3;
      RVar3 = ForceFieldOptions::getEnergyUnitScaling((ForceFieldOptions *)0x28cb18);
      UFFAdapter::makeUFF((UFFAdapter *)in_stack_fffffffffffffdf0,r1_00,(RealType)theta0_00,in_RDX,
                          in_RDI,(RealType)CONCAT44(iVar1,in_stack_fffffffffffffea8),
                          in_stack_fffffffffffffea0,(RealType)AT,Uj_00,RVar5 * RVar3,Hard_00,
                          Radius_00);
    }
    std::__cxx11::string::~string(local_d0);
  }
  StringTokenizer::~StringTokenizer(in_stack_fffffffffffffdf0);
  return;
}

Assistant:

void UFFAtomTypesSectionParser::parseLine(ForceField& ff,
                                            const std::string& line,
                                            int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();

    // in UFFAtomTypesSectionParser, a line at least contains 12 tokens:
    // Atom r1 theta0 x1 D1 zeta Z1 Vi Uj Xi Hard Radius

    if (nTokens < 12) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "UFFAtomTypesSectionParser Error: "
               "Not enough tokens at line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    } else {
      std::string atomTypeName = tokenizer.nextToken();
      AtomType* atomType       = ff.getAtomType(atomTypeName);

      if (atomType != NULL) {
        UFFAdapter uffa = UFFAdapter(atomType);

        RealType r1     = tokenizer.nextTokenAsDouble();
        RealType theta0 = tokenizer.nextTokenAsDouble();
        RealType x1     = tokenizer.nextTokenAsDouble();
        RealType D1     = tokenizer.nextTokenAsDouble();
        RealType zeta   = tokenizer.nextTokenAsDouble();
        RealType Z1     = tokenizer.nextTokenAsDouble();
        RealType Vi     = tokenizer.nextTokenAsDouble();
        RealType Uj     = tokenizer.nextTokenAsDouble();
        RealType Xi     = tokenizer.nextTokenAsDouble();
        RealType Hard   = tokenizer.nextTokenAsDouble();
        RealType Radius = tokenizer.nextTokenAsDouble();

        r1 *= options_.getDistanceUnitScaling();
        theta0 *= options_.getAngleUnitScaling();
        x1 *= options_.getDistanceUnitScaling();
        D1 *= options_.getEnergyUnitScaling();
        Z1 *= options_.getChargeUnitScaling();
        Vi *= options_.getEnergyUnitScaling();
        Uj *= options_.getEnergyUnitScaling();

        uffa.makeUFF(r1, theta0, x1, D1, zeta, Z1, Vi, Uj, Xi, Hard, Radius);

      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "UFFAtomTypesSectionParser Error: Atom Type [%s]"
                 " has not been created yet\n",
                 atomTypeName.c_str());
        painCave.isFatal = 1;
        simError();
      }
    }
  }